

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_map_s_unittest.cpp
# Opt level: O1

void __thiscall
SortMapSUnitTest_insert_Test::~SortMapSUnitTest_insert_Test(SortMapSUnitTest_insert_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(SortMapSUnitTest, insert)
{
    using MyMap = estl::sort_map_s<std::string, std::string, 30>;
    MyMap m;

    {
        MyMap::value_type elem("key_100", "val_100");
        const auto it = m.insert(elem);
        EXPECT_EQ(1u, m.size());
        EXPECT_EQ("val_100", it->second);
        EXPECT_EQ("val_100", m["key_100"]);
    }

    {
        MyMap::value_type elem("key_090", "val_090");
        const auto it = m.insert(elem);
        EXPECT_EQ(2u, m.size());
        EXPECT_EQ("val_090", it->second);
        EXPECT_EQ("val_090", m["key_090"]);
    }

}